

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::MemberAccessExpression::requireLValueImpl
          (MemberAccessExpression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  Scope *pSVar1;
  bool bVar2;
  uint uVar3;
  Type *this_00;
  Diagnostic *pDVar4;
  Symbol *pSVar5;
  NetSymbol *net;
  undefined1 in_stack_00000008 [16];
  
  this_00 = Type::getCanonicalType((this->value_->type).ptr);
  bVar2 = Type::isClass(this_00);
  if (((bVar2) || (bVar2 = Type::isCovergroup(this_00), bVar2)) ||
     (bVar2 = Type::isVoid(this_00), bVar2)) {
    uVar3 = (((ValueSymbol *)this->member)->super_Symbol).kind - Variable;
    if ((uVar3 < 0x19) && ((0x1800c0fU >> (uVar3 & 0x1f) & 1) != 0)) {
      if (longestStaticPrefix == (Expression *)0x0) {
        longestStaticPrefix = &this->super_Expression;
      }
      ASTContext::addDriver(context,(ValueSymbol *)this->member,longestStaticPrefix,flags);
      bVar2 = ValueExpressionBase::checkVariableAssignment
                        ((ValueExpressionBase *)context,(ASTContext *)this->member,
                         (VariableSymbol *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::AssignFlags>)location._0_1_,
                         (this->super_Expression).sourceRange.startLoc,
                         (SourceRange)in_stack_00000008);
      return bVar2;
    }
    if (((ulong)location & 0xfffffff) == 0) {
      location = (this->super_Expression).sourceRange.startLoc;
    }
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x560007,location);
    Diagnostic::addNote(pDVar4,(DiagCode)0x50001,this->member->location);
    Diagnostic::operator<<(pDVar4,(this->super_Expression).sourceRange);
    return false;
  }
  pSVar5 = this->member;
  uVar3 = pSVar5->kind - Variable;
  if (((uVar3 < 0x19) && ((0x1800c0fU >> (uVar3 & 0x1f) & 1) != 0)) &&
     (((ulong)pSVar5[5].name._M_str & 0x400000000) != 0)) {
    do {
      pSVar1 = pSVar5->parentScope;
      if (pSVar1 == (Scope *)0x0) goto LAB_003d6f27;
      pSVar5 = pSVar1->thisSym;
    } while ((2 < pSVar5->kind - CovergroupBody) && (pSVar5->kind != CovergroupType));
    if (pSVar1 != (context->scope).ptr) {
LAB_003d6f27:
      pDVar4 = ASTContext::addDiag(context,(DiagCode)0x450007,location);
      Diagnostic::operator<<(pDVar4,this->member->name);
      return false;
    }
  }
  pSVar5 = Expression::getSymbolReference(this->value_,true);
  if (((pSVar5 != (Symbol *)0x0) && (pSVar5->kind == Net)) &&
     (*(int *)(pSVar5[5].name._M_str + 0x80) == 0xe)) {
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0xa80007,(this->super_Expression).sourceRange);
    Diagnostic::operator<<(pDVar4,pSVar5->name);
  }
  if (longestStaticPrefix == (Expression *)0x0) {
    longestStaticPrefix = &this->super_Expression;
  }
  bVar2 = Expression::requireLValue(this->value_,context,location,flags,longestStaticPrefix);
  return bVar2;
}

Assistant:

bool MemberAccessExpression::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                               bitmask<AssignFlags> flags,
                                               const Expression* longestStaticPrefix) const {
    // If this is a selection of a class or covergroup member, assignability depends only
    // on the selected member and not on the handle itself. Otherwise, the opposite is true.
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isClass() || valueType.isCovergroup() || valueType.isVoid()) {
        if (VariableSymbol::isKind(member.kind)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = this;

            auto& var = member.as<VariableSymbol>();
            context.addDriver(var, *longestStaticPrefix, flags);

            return ValueExpressionBase::checkVariableAssignment(context,
                                                                member.as<VariableSymbol>(), flags,
                                                                location, sourceRange);
        }

        if (!location)
            location = sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag.addNote(diag::NoteDeclarationHere, member.location);
        diag << sourceRange;
        return false;
    }

    if (VariableSymbol::isKind(member.kind) &&
        member.as<VariableSymbol>().flags.has(VariableFlags::ImmutableCoverageOption) &&
        !isWithinCovergroup(member, *context.scope)) {
        context.addDiag(diag::CoverOptionImmutable, location) << member.name;
        return false;
    }

    if (auto sym = value().getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& net = sym->as<NetSymbol>();
        if (net.netType.netKind == NetType::UserDefined)
            context.addDiag(diag::UserDefPartialDriver, sourceRange) << net.name;
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;

    return value().requireLValue(context, location, flags, longestStaticPrefix);
}